

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O1

void __thiscall FArchive::UserReadClass(FArchive *this,PClass **type)

{
  PClass *pPVar1;
  BYTE newclass;
  char local_19;
  
  (*this->_vptr_FArchive[3])(this,&local_19,1);
  if (local_19 == '\x02') {
    *type = (PClass *)0x0;
  }
  else {
    if (local_19 == '\x01') {
      pPVar1 = ReadClass(this);
    }
    else {
      if (local_19 != '\0') {
        I_Error("Unknown class type %d in archive.\n");
        return;
      }
      pPVar1 = ReadStoredClass(this,DObject::RegistrationInfo.MyClass);
    }
    *type = pPVar1;
  }
  return;
}

Assistant:

void FArchive::UserReadClass (PClass *&type)
{
	BYTE newclass;

	Read (&newclass, 1);
	switch (newclass)
	{
	case 0:
		type = ReadStoredClass (RUNTIME_CLASS(DObject));
		break;
	case 1:
		type = ReadClass ();
		break;
	case 2:
		type = NULL;
		break;
	default:
		I_Error ("Unknown class type %d in archive.\n", newclass);
		break;
	}
}